

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O2

int Of_SetLastCutIsContained(Of_Cut_t **pCuts,int nCuts)

{
  Of_Cut_t *pCut;
  Of_Cut_t *pBase;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  if (0 < nCuts) {
    uVar2 = (ulong)(uint)nCuts;
  }
  uVar3 = 0;
  while( true ) {
    if (uVar2 == uVar3) {
      return 0;
    }
    pCut = pCuts[uVar3];
    pBase = pCuts[nCuts];
    if (((*(uint *)&pCut->field_0x10 >> 0x1b <= *(uint *)&pBase->field_0x10 >> 0x1b) &&
        ((pCut->Sign & ~pBase->Sign) == 0)) &&
       (iVar1 = Of_SetCutIsContainedOrder(pBase,pCut), iVar1 != 0)) break;
    uVar3 = uVar3 + 1;
  }
  return 1;
}

Assistant:

static inline int Of_SetLastCutIsContained( Of_Cut_t ** pCuts, int nCuts )
{
    int i;
    for ( i = 0; i < nCuts; i++ )
        if ( pCuts[i]->nLeaves <= pCuts[nCuts]->nLeaves && (pCuts[i]->Sign & pCuts[nCuts]->Sign) == pCuts[i]->Sign && Of_SetCutIsContainedOrder(pCuts[nCuts], pCuts[i]) )
            return 1;
    return 0;
}